

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.h
# Opt level: O1

void __thiscall FCommandBuffer::AddString(FCommandBuffer *this,FString *clip)

{
  long newlen;
  
  if (*(int *)(clip->Chars + -0xc) != 0) {
    newlen = FString::IndexOfAny(clip,"\r\n\b",0);
    if (-1 < newlen) {
      FString::Truncate(clip,newlen);
    }
    if (*(int *)((this->Text).Chars + -0xc) == 0) {
      FString::operator=(&this->Text,clip);
    }
    else {
      FString::Insert(&this->Text,(ulong)this->CursorPos,clip);
    }
    this->CursorPos = this->CursorPos + *(int *)(clip->Chars + -0xc);
    MakeStartPosGood(this);
    return;
  }
  return;
}

Assistant:

const FStringData *Data() const { return (FStringData *)Chars - 1; }